

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QStyleSheetBorderData>::reset
          (QSharedDataPointer<QStyleSheetBorderData> *this,QStyleSheetBorderData *ptr)

{
  QStyleSheetBorderData *this_00;
  
  this_00 = (this->d).ptr;
  if (this_00 != ptr) {
    if (ptr != (QStyleSheetBorderData *)0x0) {
      LOCK();
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i =
           (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      this_00 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (this_00 != (QStyleSheetBorderData *)0x0) {
      LOCK();
      (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        QStyleSheetBorderData::~QStyleSheetBorderData(this_00);
        operator_delete(this_00,0x70);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }